

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwidgettextcontrol_p.cpp
# Opt level: O2

void QUnicodeControlCharacterMenu::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QObject *object;
  qsizetype qVar1;
  QTextEdit *this;
  QWidgetTextControl *this_00;
  QLineEdit *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<QAction_*> QStack_48;
  QAction *pQStack_28;
  long lStack_20;
  
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  lStack_20 = *(long *)(in_FS_OFFSET + 0x28);
  object = (QObject *)QObject::sender();
  pQStack_28 = QtPrivate::qobject_cast_helper<QAction*,QObject>(object);
  QWidget::actions((QList<QAction_*> *)&QStack_48,(QWidget *)_o);
  qVar1 = QtPrivate::indexOf<QAction*,QAction*>((QList<QAction_*> *)&QStack_48,&pQStack_28,0);
  QArrayDataPointer<QAction_*>::~QArrayDataPointer(&QStack_48);
  if ((uint)qVar1 < 0xe) {
    QStack_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QStack_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QStack_48.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)&QStack_48,
                     (QChar)(char16_t)
                            *(undefined4 *)
                             ((long)&qt_controlCharacters[0].character +
                             (ulong)(((uint)qVar1 & 0xf) << 4)));
    this = QtPrivate::qobject_cast_helper<QTextEdit*,QObject>(*(QObject **)(_o + 0x28));
    if (this == (QTextEdit *)0x0) {
      this_00 = (QWidgetTextControl *)
                QtPrivate::qobject_cast_helper<QWidgetTextControl*,QObject>
                          (*(QObject **)(_o + 0x28));
      if (this_00 != (QWidgetTextControl *)0x0) {
        QWidgetTextControl::insertPlainText(this_00,(QString *)&QStack_48);
      }
      this_01 = QtPrivate::qobject_cast_helper<QLineEdit*,QObject>(*(QObject **)(_o + 0x28));
      if (this_01 != (QLineEdit *)0x0) {
        QLineEdit::insert(this_01,(QString *)&QStack_48);
      }
    }
    else {
      QTextEdit::insertPlainText(this,(QString *)&QStack_48);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&QStack_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUnicodeControlCharacterMenu::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QUnicodeControlCharacterMenu *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->menuActionTriggered(); break;
        default: ;
        }
    }
    (void)_a;
}